

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

int imagetoraw_common(opj_image_t *image,char *outfile,OPJ_BOOL big_endian)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  opj_image_comp_t *poVar3;
  opj_image_t *poVar4;
  int iVar5;
  ulong uVar6;
  FILE *__s;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  int iVar10;
  OPJ_UINT32 OVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  OPJ_UINT32 OVar15;
  bool bVar16;
  uchar uc;
  OPJ_UINT32 local_60;
  OPJ_UINT32 local_5c;
  undefined8 local_58;
  OPJ_UINT32 local_50;
  anon_union_2_2_132597f0_conflict uc16_1;
  anon_union_2_2_132597f0 uc16;
  char *local_48;
  opj_image_t *local_40;
  ulong local_38;
  
  uVar1 = image->numcomps;
  if (image->x1 * uVar1 * image->y1 == 0) {
    pcVar7 = "\nError: invalid raw image parameters\n";
    sVar8 = 0x25;
LAB_00108f7b:
    fwrite(pcVar7,sVar8,1,_stderr);
LAB_00108f9d:
    local_58 = 1;
    goto LAB_00108f1f;
  }
  uVar6 = 4;
  if (uVar1 < 4) {
    uVar6 = (ulong)uVar1;
  }
  iVar5 = (int)uVar6;
  iVar10 = iVar5 + (uint)(iVar5 == 0);
  lVar14 = 0x60;
  for (uVar12 = 1; uVar12 < uVar6; uVar12 = uVar12 + 1) {
    poVar3 = image->comps;
    if ((((poVar3->dx != *(OPJ_UINT32 *)((long)poVar3 + lVar14 + -0x20)) ||
         (poVar3->dy != *(OPJ_UINT32 *)((long)poVar3 + lVar14 + -0x1c))) ||
        (poVar3->prec != *(OPJ_UINT32 *)((long)poVar3 + lVar14 + -8))) ||
       (poVar3->sgnd != *(OPJ_UINT32 *)((long)&poVar3->dx + lVar14))) {
      iVar10 = (int)uVar12;
      break;
    }
    lVar14 = lVar14 + 0x40;
  }
  if (iVar10 != iVar5) {
    fwrite("imagetoraw_common: All components shall have the same subsampling, same bit depth, same sign.\n"
           ,0x5e,1,_stderr);
    pcVar7 = "\tAborting\n";
    sVar8 = 10;
    goto LAB_00108f7b;
  }
  __s = fopen(outfile,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for writing !!\n",outfile);
    goto LAB_00108f9d;
  }
  local_58 = 0;
  local_48 = outfile;
  fprintf(_stdout,"Raw image characteristics: %d components\n",(ulong)image->numcomps);
  uVar6 = 0;
  local_40 = image;
  while (poVar4 = local_40, uVar6 < local_40->numcomps) {
    poVar3 = local_40->comps;
    pcVar7 = "unsigned";
    if (poVar3[uVar6].sgnd == 1) {
      pcVar7 = "signed";
    }
    fprintf(_stdout,"Component %u characteristics: %dx%dx%d %s\n",uVar6 & 0xffffffff,
            (ulong)poVar3[uVar6].w,(ulong)poVar3[uVar6].h,(ulong)poVar3[uVar6].prec,pcVar7);
    poVar3 = poVar4->comps;
    OVar15 = poVar3[uVar6].w;
    OVar2 = poVar3[uVar6].h;
    uVar1 = poVar3[uVar6].prec;
    bVar9 = (byte)uVar1;
    local_38 = uVar6;
    if (8 < uVar1) {
      if (uVar1 < 0x11) {
        if (poVar3[uVar6].sgnd == 0) {
          OVar11 = 0;
          local_60 = OVar15;
          if ((int)OVar15 < 1) {
            local_60 = 0;
          }
          piVar13 = poVar3[uVar6].data;
          local_5c = OVar2;
          if ((int)OVar2 < 1) {
            local_5c = 0;
          }
          for (; OVar15 = local_60, OVar11 != local_5c; OVar11 = OVar11 + 1) {
            while (bVar16 = OVar15 != 0, OVar15 = OVar15 - 1, bVar16) {
              iVar5 = *piVar13;
              if (iVar5 < 1) {
                iVar5 = 0;
              }
              if (0xfffe < iVar5) {
                iVar5 = 0xffff;
              }
              uc16_1.val = (ushort)iVar5 & ~(ushort)(-1 << (bVar9 & 0x1f));
              sVar8 = fwrite(&uc16_1,1,2,__s);
              if (sVar8 < 2) goto LAB_00108ef2;
              piVar13 = piVar13 + 1;
            }
          }
        }
        else if (poVar3[uVar6].sgnd == 1) {
          OVar11 = 0;
          local_60 = OVar15;
          if ((int)OVar15 < 1) {
            local_60 = 0;
          }
          piVar13 = poVar3[uVar6].data;
          local_5c = OVar2;
          if ((int)OVar2 < 1) {
            local_5c = 0;
          }
          for (; OVar15 = local_60, OVar11 != local_5c; OVar11 = OVar11 + 1) {
            while (bVar16 = OVar15 != 0, OVar15 = OVar15 - 1, bVar16) {
              iVar5 = *piVar13;
              if (iVar5 < -0x7fff) {
                iVar5 = -0x8000;
              }
              if (0x7ffe < iVar5) {
                iVar5 = 0x7fff;
              }
              uc16.val = (ushort)iVar5 & ~(ushort)(-1 << (bVar9 & 0x1f));
              sVar8 = fwrite(&uc16,1,2,__s);
              if (sVar8 < 2) goto LAB_00108ef2;
              piVar13 = piVar13 + 1;
              local_58 = 0;
            }
          }
        }
        goto LAB_00108ecd;
      }
      if (uVar1 < 0x21) {
        fwrite("More than 16 bits per component not handled yet\n",0x30,1,_stderr);
      }
      else {
        fprintf(_stderr,"Error: invalid precision: %d\n",(ulong)uVar1);
      }
      goto LAB_00108f0f;
    }
    if (poVar3[uVar6].sgnd == 0) {
      OVar11 = 0;
      if ((int)OVar15 < 1) {
        OVar15 = 0;
      }
      piVar13 = poVar3[uVar6].data;
      local_60 = OVar15;
      local_5c = OVar2;
      if ((int)OVar2 < 1) {
        local_5c = 0;
      }
      while (OVar15 = local_60, OVar11 != local_5c) {
        while (local_50 = OVar11, OVar15 != 0) {
          iVar5 = *piVar13;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          uc = (byte)iVar5 & ~(byte)(-1 << (bVar9 & 0x1f));
          sVar8 = fwrite(&uc,1,1,__s);
          if (sVar8 == 0) goto LAB_00108edf;
          piVar13 = piVar13 + 1;
          OVar15 = OVar15 - 1;
          OVar11 = local_50;
        }
        OVar11 = local_50 + 1;
      }
    }
    else if (poVar3[uVar6].sgnd == 1) {
      OVar11 = 0;
      if ((int)OVar15 < 1) {
        OVar15 = 0;
      }
      piVar13 = poVar3[uVar6].data;
      local_60 = OVar15;
      local_5c = OVar2;
      if ((int)OVar2 < 1) {
        local_5c = 0;
      }
      while (OVar15 = local_60, OVar11 != local_5c) {
        while (local_50 = OVar11, OVar15 != 0) {
          iVar5 = *piVar13;
          if (iVar5 < -0x7f) {
            iVar5 = -0x80;
          }
          if (0x7e < iVar5) {
            iVar5 = 0x7f;
          }
          uc = (byte)iVar5 & ~(byte)(-1 << (bVar9 & 0x1f));
          sVar8 = fwrite(&uc,1,1,__s);
          if (sVar8 == 0) goto LAB_00108edf;
          piVar13 = piVar13 + 1;
          OVar15 = OVar15 - 1;
          OVar11 = local_50;
        }
        OVar11 = local_50 + 1;
      }
    }
LAB_00108ecd:
    uVar6 = local_38 + 1;
  }
  goto LAB_00108f17;
LAB_00108ef2:
  pcVar7 = "failed to write 2 byte for %s\n";
  goto LAB_00108f03;
LAB_00108edf:
  pcVar7 = "failed to write 1 byte for %s\n";
LAB_00108f03:
  fprintf(_stderr,pcVar7,local_48);
LAB_00108f0f:
  local_58 = 1;
LAB_00108f17:
  fclose(__s);
LAB_00108f1f:
  return (int)local_58;
}

Assistant:

static int imagetoraw_common(opj_image_t * image, const char *outfile,
                             OPJ_BOOL big_endian)
{
    FILE *rawFile = NULL;
    size_t res;
    unsigned int compno, numcomps;
    int w, h, fails;
    int line, row, curr, mask;
    int *ptr;
    unsigned char uc;
    (void)big_endian;

    if ((image->numcomps * image->x1 * image->y1) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        return 1;
    }

    numcomps = image->numcomps;

    if (numcomps > 4) {
        numcomps = 4;
    }

    for (compno = 1; compno < numcomps; ++compno) {
        if (image->comps[0].dx != image->comps[compno].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[compno].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[compno].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[compno].sgnd) {
            break;
        }
    }
    if (compno != numcomps) {
        fprintf(stderr,
                "imagetoraw_common: All components shall have the same subsampling, same bit depth, same sign.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    rawFile = fopen(outfile, "wb");
    if (!rawFile) {
        fprintf(stderr, "Failed to open %s for writing !!\n", outfile);
        return 1;
    }

    fails = 1;
    fprintf(stdout, "Raw image characteristics: %d components\n", image->numcomps);

    for (compno = 0; compno < image->numcomps; compno++) {
        fprintf(stdout, "Component %u characteristics: %dx%dx%d %s\n", compno,
                image->comps[compno].w,
                image->comps[compno].h, image->comps[compno].prec,
                image->comps[compno].sgnd == 1 ? "signed" : "unsigned");

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        if (image->comps[compno].prec <= 8) {
            if (image->comps[compno].sgnd == 1) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 127) {
                            curr = 127;
                        } else if (curr < -128) {
                            curr = -128;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 255) {
                            curr = 255;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 16) {
            if (image->comps[compno].sgnd == 1) {
                union {
                    signed short val;
                    signed char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 32767) {
                            curr = 32767;
                        } else if (curr < -32768) {
                            curr = -32768;
                        }
                        uc16.val = (signed short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                union {
                    unsigned short val;
                    unsigned char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 65535) {
                            curr = 65535;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc16.val = (unsigned short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 32) {
            fprintf(stderr, "More than 16 bits per component not handled yet\n");
            goto fin;
        } else {
            fprintf(stderr, "Error: invalid precision: %d\n", image->comps[compno].prec);
            goto fin;
        }
    }
    fails = 0;
fin:
    fclose(rawFile);
    return fails;
}